

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPN::OPN(OPN *this)

{
  Channel4 *local_28;
  int local_20;
  int i;
  OPN *this_local;
  
  OPNBase::OPNBase(&this->super_OPNBase);
  (this->super_OPNBase).super_Timer._vptr_Timer = (_func_int **)&PTR_SetStatus_002fbae0;
  local_28 = (Channel4 *)&this->field_0x1d8;
  do {
    Channel4::Channel4(local_28);
    local_28 = local_28 + 1;
  } while ((OPN *)local_28 != this + 1);
  OPNBase::SetVolumeFM(&this->super_OPNBase,0);
  OPNBase::SetVolumePSG(&this->super_OPNBase,0);
  (this->super_OPNBase).csmch = (Channel4 *)&this->field_0x798;
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    Channel4::SetChip((Channel4 *)(this->fnum2 + (long)local_20 * 0x2e0 + 8),
                      &(this->super_OPNBase).chip);
    Channel4::SetType((Channel4 *)(this->fnum2 + (long)local_20 * 0x2e0 + 8),typeN);
  }
  return;
}

Assistant:

OPN::OPN()
{
	SetVolumeFM(0);
	SetVolumePSG(0);

	csmch = &ch[2];

	for (int i=0; i<3; i++)
	{
		ch[i].SetChip(&chip);
		ch[i].SetType(typeN);
	}
}